

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PStatePointer::ReadValue(PStatePointer *this,FArchive *ar,void *addr)

{
  byte local_29;
  FState **ppFStack_28;
  BYTE tag;
  void *addr_local;
  FArchive *ar_local;
  PStatePointer *this_local;
  
  ppFStack_28 = (FState **)addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  FArchive::operator<<(ar,&local_29);
  if (local_29 != 0x11) {
    PType::SkipValue((FArchive *)addr_local,(uint)local_29);
  }
  else {
    ::operator<<((FArchive *)addr_local,ppFStack_28);
  }
  this_local._7_1_ = local_29 == 0x11;
  return this_local._7_1_;
}

Assistant:

bool PStatePointer::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag == VAL_State)
	{
		ar << *(FState **)addr;
		return true;
	}
	SkipValue(ar, tag);
	return false;
}